

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_channel.cpp
# Opt level: O3

bool __thiscall BmsChannel::IsFirstPlayerNoteChannel(BmsChannel *this)

{
  int iVar1;
  
  iVar1 = GetChannelType(this);
  return iVar1 == 0x33 || iVar1 == 0xb;
}

Assistant:

bool
BmsChannel::IsFirstPlayerNoteChannel(void) const
{
	switch (GetChannelType()) {
	case BmsChannelType::FIRSTPLAYER:
	case BmsChannelType::FIRSTPLAYERLN:
		return true;
	default:
		return false;
	}
}